

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  uint uVar2;
  int iVar3;
  DataType dataType;
  TestNode *pTVar4;
  long *plVar5;
  ShaderMatrixCase *pSVar6;
  ulong uVar7;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string vecMatName;
  ShaderInput scalarIn;
  undefined4 uStack_1ac;
  long local_1a8;
  long lStack_1a0;
  ulong local_198;
  char local_189;
  TestNode *local_188;
  TestNode *local_180;
  Precision local_178;
  DataType local_174;
  ShaderInput matIn;
  allocator<char> local_161;
  string baseName;
  ShaderInput otherMatIn;
  undefined4 uStack_134;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  InputType local_fc;
  char *local_f8;
  ShaderInput vecIn;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  InputType local_c0;
  uint local_bc;
  uint local_b8;
  InputType local_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  char *local_90;
  long local_88;
  InputTypeSpec *local_80;
  ulong local_78;
  long local_70;
  InputTypeSpec *local_68;
  char *local_60;
  long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  lVar10 = 0;
  local_188 = (TestNode *)this;
  do {
    local_80 = init::reducedInputTypes;
    local_189 = init::ops[lVar10].extendedInputTypeCases;
    if ((bool)local_189 != false) {
      local_80 = init::extendedInputTypes;
    }
    local_198 = (ulong)init::ops[lVar10].op;
    local_88 = lVar10;
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,local_188->m_testCtx,init::ops[lVar10].name,
               init::ops[lVar10].desc);
    local_180 = pTVar4;
    tcu::TestNode::addChild(local_188,pTVar4);
    iVar3 = (int)local_198;
    local_c0 = (iVar3 != 3) + INPUTTYPE_UNIFORM;
    local_b8 = iVar3 - 5;
    local_bc = iVar3 - 0xb;
    uVar7 = 0;
    do {
      local_68 = local_80 + uVar7;
      local_b4 = local_68->type;
      local_fc = local_b4;
      if (local_b4 == INPUTTYPE_DYNAMIC) {
        local_fc = INPUTTYPE_UNIFORM;
      }
      lVar10 = 0;
      local_78 = uVar7;
      do {
        local_174 = init::matrixTypes[lVar10];
        local_70 = lVar10;
        local_f8 = glu::getDataTypeName(local_174);
        lVar10 = 0;
        do {
          paVar11 = &vecMatName.field_2;
          local_178 = *(Precision *)((long)init::precisions + lVar10);
          local_58 = lVar10;
          local_90 = glu::getPrecisionName(local_178);
          local_60 = local_68->name;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,local_60,(allocator<char> *)&local_b0);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_110 = *plVar8;
            lStack_108 = plVar5[3];
            local_120 = &local_110;
          }
          else {
            local_110 = *plVar8;
            local_120 = (long *)*plVar5;
          }
          local_118 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_130 = *plVar8;
            lStack_128 = plVar5[3];
            otherMatIn._0_8_ = &local_130;
          }
          else {
            local_130 = *plVar8;
            otherMatIn._0_8_ = (long *)*plVar5;
          }
          unique0x00012000 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
          scalarIn._0_8_ = &local_1a8;
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_1a8 = *plVar8;
            lStack_1a0 = plVar5[3];
          }
          else {
            local_1a8 = *plVar8;
            scalarIn._0_8_ = (long *)*plVar5;
          }
          unique0x00012000 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar9) {
            vecMatName.field_2._M_allocated_capacity = *psVar9;
            vecMatName.field_2._8_8_ = plVar5[3];
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            vecMatName.field_2._M_allocated_capacity = *psVar9;
            vecMatName._M_dataplus._M_p = (pointer)*plVar5;
          }
          vecMatName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&vecMatName);
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar9) {
            baseName.field_2._M_allocated_capacity = *psVar9;
            baseName.field_2._8_8_ = plVar5[3];
          }
          else {
            baseName.field_2._M_allocated_capacity = *psVar9;
            baseName._M_dataplus._M_p = (pointer)*plVar5;
          }
          baseName._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vecMatName._M_dataplus._M_p != paVar11) {
            operator_delete(vecMatName._M_dataplus._M_p,vecMatName.field_2._M_allocated_capacity + 1
                           );
          }
          if ((long *)scalarIn._0_8_ != &local_1a8) {
            operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
          }
          if ((long *)otherMatIn._0_8_ != &local_130) {
            operator_delete((void *)otherMatIn._0_8_,local_130 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0,local_d0 + 1);
          }
          matIn.inputType = local_b4;
          matIn.dataType = local_174;
          matIn.precision = local_178;
          uVar2 = (uint)local_198;
          if (uVar2 < 4) {
            scalarIn.dataType = TYPE_FLOAT;
            scalarIn.inputType = local_c0;
            stack0xfffffffffffffe50 = CONCAT44(uStack_1ac,local_178);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pTVar4 = local_188;
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)pTVar4[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-scalar case",&matIn,
                       &scalarIn,(MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            uVar2 = (uint)local_198;
          }
          if (uVar2 == 2) {
            iVar3 = glu::getDataTypeMatrixNumColumns(local_174);
            dataType = glu::getDataTypeFloatVec(iVar3);
            vecIn.inputType = INPUTTYPE_DYNAMIC;
            vecIn.precision = local_178;
            vecIn.dataType = dataType;
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            glu::getDataTypeName(dataType);
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName.field_2._8_8_ = plVar5[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,&vecIn,
                       (MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != &vecMatName.field_2) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            glu::getDataTypeName(dataType);
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            vecMatName._M_dataplus._M_p = (pointer)&vecMatName.field_2;
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName.field_2._8_8_ = plVar5[3];
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-vector case",&matIn,&vecIn,
                       (MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            paVar11 = &vecMatName.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_50,local_60,&local_161);
            plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
            local_b0 = &local_a0;
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_a0 = *plVar8;
              lStack_98 = plVar5[3];
            }
            else {
              local_a0 = *plVar8;
              local_b0 = (long *)*plVar5;
            }
            local_a8 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_d0 = *plVar8;
              lStack_c8 = plVar5[3];
              local_e0 = &local_d0;
            }
            else {
              local_d0 = *plVar8;
              local_e0 = (long *)*plVar5;
            }
            local_d8 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_110 = *plVar8;
              lStack_108 = plVar5[3];
              local_120 = &local_110;
            }
            else {
              local_110 = *plVar8;
              local_120 = (long *)*plVar5;
            }
            local_118 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            glu::getDataTypeName(dataType);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_130 = *plVar8;
              lStack_128 = plVar5[3];
              otherMatIn._0_8_ = &local_130;
            }
            else {
              local_130 = *plVar8;
              otherMatIn._0_8_ = (long *)*plVar5;
            }
            unique0x00012000 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&otherMatIn);
            scalarIn._0_8_ = &local_1a8;
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_1a8 = *plVar8;
              lStack_1a0 = plVar5[3];
            }
            else {
              local_1a8 = *plVar8;
              scalarIn._0_8_ = (long *)*plVar5;
            }
            unique0x00012000 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName.field_2._8_8_ = plVar5[3];
              vecMatName._M_dataplus._M_p = (pointer)paVar11;
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            if ((long *)otherMatIn._0_8_ != &local_130) {
              operator_delete((void *)otherMatIn._0_8_,local_130 + 1);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if (local_e0 != &local_d0) {
              operator_delete(local_e0,local_d0 + 1);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,local_a0 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                       (MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,vecMatName._M_dataplus._M_p,
                       vecMatName._M_dataplus._M_p + vecMatName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,(char *)scalarIn._0_8_,"Vector-matrix case",&vecIn,&matIn,
                       (MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            uVar2 = (uint)local_198;
          }
          paVar11 = &vecMatName.field_2;
          if (uVar2 < 5) {
            otherMatIn.dataType = local_174;
            otherMatIn.inputType = local_fc;
            stack0xfffffffffffffec8 = CONCAT44(uStack_134,local_178);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName.field_2._8_8_ = plVar5[3];
              vecMatName._M_dataplus._M_p = (pointer)paVar11;
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,(MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            scalarIn._0_8_ = &local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&scalarIn,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&scalarIn);
            plVar5 = (long *)std::__cxx11::string::append((char *)&scalarIn);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName.field_2._8_8_ = plVar5[3];
              vecMatName._M_dataplus._M_p = (pointer)paVar11;
            }
            else {
              vecMatName.field_2._M_allocated_capacity = *psVar9;
              vecMatName._M_dataplus._M_p = (pointer)*plVar5;
            }
            vecMatName._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix-matrix case",&matIn,
                       &otherMatIn,(MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            if ((long *)scalarIn._0_8_ != &local_1a8) {
              operator_delete((void *)scalarIn._0_8_,local_1a8 + 1);
            }
          }
          if (local_b8 < 6) {
            scalarIn.inputType = INPUTTYPE_LAST;
            scalarIn.dataType = TYPE_LAST;
            stack0xfffffffffffffe50 = CONCAT44(uStack_1ac,3);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                       (MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix case",&matIn,&scalarIn,
                       (MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_bc < 4) {
            scalarIn.dataType = local_174;
            scalarIn.inputType = local_fc;
            stack0xfffffffffffffe50 = CONCAT44(uStack_1ac,local_178);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,(MatrixOp)local_198,true);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar1 = (Context *)local_188[1]._vptr_TestNode;
            vecMatName._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&vecMatName,baseName._M_dataplus._M_p,
                       baseName._M_dataplus._M_p + baseName._M_string_length);
            std::__cxx11::string::append((char *)&vecMatName);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar1,vecMatName._M_dataplus._M_p,"Matrix assignment case",&matIn,
                       &scalarIn,(MatrixOp)local_198,false);
            tcu::TestNode::addChild(local_180,(TestNode *)pSVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vecMatName._M_dataplus._M_p != paVar11) {
              operator_delete(vecMatName._M_dataplus._M_p,
                              vecMatName.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)baseName._M_dataplus._M_p != &baseName.field_2) {
            operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
          }
          lVar10 = local_58 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_70 + 1;
      } while (lVar10 != 3);
    } while ((local_78 < 2) && (uVar7 = local_78 + 1, local_189 != '\0'));
    lVar10 = local_88 + 1;
  } while (lVar10 != 0xf);
  return 0xf;
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	vecType	= getDataTypeFloatVec(getDataTypeMatrixNumColumns(matType));
						ShaderInput vecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, vecType, precision);

						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_vertex").c_str(),	"Matrix-vector case", matIn, vecIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, vecIn, op, false));

						// Vector-matrix.
						string vecMatName = string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + getDataTypeName(vecType) + "_" + matTypeName;
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", vecIn, matIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", vecIn, matIn, op, false));
					}

					if (isOperationMatrixMatrix(op))
					{
						// Matrix-matrix.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationUnary(op))
					{
						// op matrix
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if (isOperationAssignment(op))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}